

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  interval_t right_00;
  bool bVar1;
  dtime_tz_t dVar2;
  interval_t *piVar3;
  dtime_tz_t *pdVar4;
  Vector *in_RDX;
  Vector *in_RSI;
  dtime_tz_t *result_data;
  interval_t *rdata;
  dtime_tz_t *ldata;
  idx_t idx;
  ValidityMask *mask;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 fun_00;
  undefined7 uVar5;
  VectorType in_stack_ffffffffffffffcf;
  undefined1 uVar6;
  Vector *in_stack_ffffffffffffffd0;
  
  fun_00 = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  Vector::SetVectorType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  dVar2.bits = (uint64_t)ConstantVector::GetData<duckdb::dtime_tz_t>((Vector *)0x12a8c04);
  piVar3 = ConstantVector::GetData<duckdb::interval_t>((Vector *)0x12a8c13);
  pdVar4 = ConstantVector::GetData<duckdb::dtime_tz_t>((Vector *)0x12a8c22);
  uVar5 = SUB87(pdVar4,0);
  uVar6 = (undefined1)((ulong)pdVar4 >> 0x38);
  bVar1 = ConstantVector::IsNull((Vector *)0x12a8c31);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x12a8c3f), !bVar1)) {
    mask = (ValidityMask *)((dtime_tz_t *)dVar2.bits)->bits;
    idx = piVar3->micros;
    ConstantVector::Validity(in_RDX);
    right_00.days._3_1_ = uVar6;
    right_00._0_7_ = uVar5;
    right_00.micros = (int64_t)piVar3;
    dVar2 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::AddTimeOperator,duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t>
                      ((bool)fun_00,dVar2,right_00,mask,idx);
    *(uint64_t *)CONCAT17(uVar6,uVar5) = dVar2.bits;
    return;
  }
  ConstantVector::SetNull(in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}